

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

OneofOptions * __thiscall
google::protobuf::OneofDescriptorProto::_internal_mutable_options(OneofDescriptorProto *this)

{
  Arena *arena;
  OneofOptions *pOVar1;
  OneofOptions *p;
  OneofDescriptorProto *this_local;
  
  if ((this->field_0)._impl_.options_ == (OneofOptions *)0x0) {
    arena = MessageLite::GetArena((MessageLite *)this);
    pOVar1 = (OneofOptions *)Arena::DefaultConstruct<google::protobuf::OneofOptions>(arena);
    (this->field_0)._impl_.options_ = pOVar1;
  }
  return (this->field_0)._impl_.options_;
}

Assistant:

inline ::google::protobuf::OneofOptions* PROTOBUF_NONNULL OneofDescriptorProto::_internal_mutable_options() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.options_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::OneofOptions>(GetArena());
    _impl_.options_ = reinterpret_cast<::google::protobuf::OneofOptions*>(p);
  }
  return _impl_.options_;
}